

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::AddTxAnnouncement
          (PeerManagerImpl *this,CNode *node,GenTxid *gtxid,microseconds current_time)

{
  bool preferred;
  long lVar1;
  NodeId peer;
  size_t sVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr *pp_Var5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peer = node->id;
  if ((node->m_permission_flags & Relay) == None) {
    sVar2 = TxRequestTracker::Count(&this->m_txrequest,peer);
    if (4999 < sVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_001d9b84;
    }
  }
  p_Var4 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (peer <= *(long *)(p_Var4 + 1)) {
      p_Var3 = p_Var4;
    }
    p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < peer];
  } while (p_Var4 != (_Base_ptr)0x0);
  pp_Var5 = &p_Var3[1]._M_parent;
  if (peer < *(long *)(p_Var3 + 1)) {
    pp_Var5 = (_Base_ptr *)0x0;
  }
  preferred = *(bool *)(pp_Var5 + 0xd);
  pp_Var5 = (_Base_ptr *)&LAB_001e8480;
  if (preferred != false) {
    pp_Var5 = (_Base_ptr *)0x0;
  }
  if ((gtxid->m_is_wtxid == false) &&
     (0 < (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i)) {
    pp_Var5 = pp_Var5 + 250000;
  }
  if ((node->m_permission_flags & Relay) == None) {
    sVar2 = TxRequestTracker::CountInFlight(&this->m_txrequest,peer);
    if (99 < sVar2) {
      pp_Var5 = pp_Var5 + 250000;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    TxRequestTracker::ReceivedInv
              (&this->m_txrequest,peer,gtxid,preferred,
               (microseconds)((long)pp_Var5 + current_time.__r));
    return;
  }
LAB_001d9b84:
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::AddTxAnnouncement(const CNode& node, const GenTxid& gtxid, std::chrono::microseconds current_time)
{
    AssertLockHeld(::cs_main); // for State
    AssertLockHeld(m_tx_download_mutex); // For m_txrequest
    NodeId nodeid = node.GetId();
    if (!node.HasPermission(NetPermissionFlags::Relay) && m_txrequest.Count(nodeid) >= MAX_PEER_TX_ANNOUNCEMENTS) {
        // Too many queued announcements from this peer
        return;
    }
    const CNodeState* state = State(nodeid);

    // Decide the TxRequestTracker parameters for this announcement:
    // - "preferred": if fPreferredDownload is set (= outbound, or NetPermissionFlags::NoBan permission)
    // - "reqtime": current time plus delays for:
    //   - NONPREF_PEER_TX_DELAY for announcements from non-preferred connections
    //   - TXID_RELAY_DELAY for txid announcements while wtxid peers are available
    //   - OVERLOADED_PEER_TX_DELAY for announcements from peers which have at least
    //     MAX_PEER_TX_REQUEST_IN_FLIGHT requests in flight (and don't have NetPermissionFlags::Relay).
    auto delay{0us};
    const bool preferred = state->fPreferredDownload;
    if (!preferred) delay += NONPREF_PEER_TX_DELAY;
    if (!gtxid.IsWtxid() && m_wtxid_relay_peers > 0) delay += TXID_RELAY_DELAY;
    const bool overloaded = !node.HasPermission(NetPermissionFlags::Relay) &&
        m_txrequest.CountInFlight(nodeid) >= MAX_PEER_TX_REQUEST_IN_FLIGHT;
    if (overloaded) delay += OVERLOADED_PEER_TX_DELAY;
    m_txrequest.ReceivedInv(nodeid, gtxid, preferred, current_time + delay);
}